

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O0

void __thiscall ccs::SearchState::SearchState(SearchState *this,shared_ptr<const_ccs::Node> *root)

{
  element_type *peVar1;
  CcsTracer *pCVar2;
  Specificity local_34;
  Specificity local_2c [2];
  __shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<const_ccs::Node> *root_local;
  SearchState *this_local;
  
  local_18 = (__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)root;
  root_local = &this->root;
  std::shared_ptr<const_ccs::Node>::shared_ptr(&this->root,root);
  std::shared_ptr<const_ccs::SearchState>::shared_ptr(&this->parent);
  std::
  map<const_ccs::Node_*,_ccs::Specificity,_std::less<const_ccs::Node_*>,_std::allocator<std::pair<const_ccs::Node_*const,_ccs::Specificity>_>_>
  ::map(&this->nodes);
  std::
  map<const_ccs::AndTally_*,_const_ccs::TallyState_*,_std::less<const_ccs::AndTally_*>,_std::allocator<std::pair<const_ccs::AndTally_*const,_const_ccs::TallyState_*>_>_>
  ::map(&this->tallyMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
  ::map(&this->properties);
  peVar1 = std::__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  pCVar2 = Node::tracer(peVar1);
  this->tracer = pCVar2;
  Key::Key(&this->key);
  this->constraintsChanged = false;
  peVar1 = std::__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  Specificity::Specificity(local_2c);
  Node::activate(peVar1,local_2c,this);
  while ((this->constraintsChanged & 1U) != 0) {
    this->constraintsChanged = false;
    peVar1 = std::__shared_ptr_access<const_ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    Specificity::Specificity(&local_34);
    Node::getChildren(peVar1,&this->key,&local_34,this);
  }
  return;
}

Assistant:

SearchState::SearchState(std::shared_ptr<const Node> &root) :
      root(root), tracer(root->tracer()) {
  constraintsChanged = false;
  root->activate(Specificity(), *this);
  while (constraintsChanged) {
    constraintsChanged = false;
    root->getChildren(key, Specificity(), *this);
  }
}